

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall pugi::impl::anon_unknown_0::gap::push(gap *this,char_t **s,size_t count)

{
  char_t *pcVar1;
  
  pcVar1 = this->end;
  if (pcVar1 != (char_t *)0x0) {
    if (*s < pcVar1) {
      __assert_fail("s >= end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x974,"void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)");
    }
    memmove(pcVar1 + -this->size,pcVar1,(long)*s - (long)pcVar1);
  }
  pcVar1 = *s;
  *s = pcVar1 + count;
  this->end = pcVar1 + count;
  this->size = this->size + count;
  return;
}

Assistant:

void push(char_t*& s, size_t count)
		{
			if (end) // there was a gap already; collapse it
			{
				// Move [old_gap_end, new_gap_start) to [old_gap_start, ...)
				assert(s >= end);
				memmove(end - size, end, reinterpret_cast<char*>(s) - reinterpret_cast<char*>(end));
			}

			s += count; // end of current gap

			// "merge" two gaps
			end = s;
			size += count;
		}